

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O0

bool __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PrepareMOIteration
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  undefined8 uVar1;
  function<mp::Solution_()> *in_RSI;
  undefined4 *in_RDI;
  function<mp::Solution_()> *in_stack_00000038;
  function<mp::sol::Status_()> *in_stack_00000040;
  MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000048;
  function<mp::Solution_()> *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff94;
  Error *in_stack_ffffffffffffff98;
  CStringRef in_stack_ffffffffffffffa0;
  BasicCStringRef<char> local_40 [3];
  BasicCStringRef<char> local_28 [4];
  byte local_1;
  
  switch(*in_RDI) {
  case 0:
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (local_28,"FlatConverter: MultiobjManager not set up");
    Error::Error(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff94);
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  case 1:
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (local_40,"FlatConverter: MultiobjManager not running");
    Error::Error(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff94);
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  case 2:
    std::function<mp::sol::Status_()>::function
              ((function<mp::sol::Status_()> *)in_RSI,
               (function<mp::sol::Status_()> *)in_stack_ffffffffffffff58);
    std::function<mp::Solution_()>::function(in_RSI,in_stack_ffffffffffffff58);
    local_1 = DoPrepareNextMultiobjSolve(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    std::function<mp::Solution_()>::~function((function<mp::Solution_()> *)0x3d47b9);
    std::function<mp::sol::Status_()>::~function((function<mp::sol::Status_()> *)0x3d47c3);
    break;
  case 3:
    local_1 = 0;
    break;
  default:
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool PrepareMOIteration(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    switch (status_) {
    case MOManagerStatus::NOT_SET:
      MP_RAISE("FlatConverter: MultiobjManager not set up");
    case MOManagerStatus::NOT_ACTIVE:
      MP_RAISE("FlatConverter: MultiobjManager not running");
    case MOManagerStatus::RUNNING:
      return DoPrepareNextMultiobjSolve(get_stt, get_sol);
    case MOManagerStatus::FINISHED:
      return false;
    }
    return false;
  }